

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogFinish(void)

{
  ImGuiLogType IVar1;
  ImGuiContext *pIVar2;
  char *text;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    IVar1 = pIVar2->LogType;
    if (IVar1 == ImGuiLogType_Clipboard) {
      if (1 < (pIVar2->LogBuffer).Buf.Size) {
        text = (pIVar2->LogBuffer).Buf.Data;
        if (text == (char *)0x0) {
          text = ImGuiTextBuffer::EmptyString;
        }
        SetClipboardText(text);
      }
    }
    else if (IVar1 == ImGuiLogType_File) {
      ImFileClose(pIVar2->LogFile);
    }
    else if (IVar1 == ImGuiLogType_TTY) {
      fflush((FILE *)pIVar2->LogFile);
    }
    pIVar2->LogEnabled = false;
    pIVar2->LogType = ImGuiLogType_None;
    pIVar2->LogFile = (ImFileHandle)0x0;
    ImVector<char>::clear(&(pIVar2->LogBuffer).Buf);
    return;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        fflush(g.LogFile);
#endif
        break;
    case ImGuiLogType_File:
        ImFileClose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}